

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboColorClearCase::render(FboColorClearCase *this,Surface *dst)

{
  int x_00;
  int y_00;
  float *pfVar1;
  uint *puVar2;
  int *piVar3;
  Vector<float,_4> local_100;
  Vector<float,_4> local_f0;
  undefined1 local_e0 [8];
  Vec4 color;
  int h;
  int w;
  int y;
  int x;
  int ndx;
  Vector<unsigned_int,_4> local_ac;
  Vector<float,_4> local_9c;
  deUint32 local_80;
  deUint32 local_7c;
  deUint32 rbo;
  deUint32 fbo;
  int numClears;
  Random rnd;
  TextureFormatInfo fmtInfo;
  TextureChannelClass fmtClass;
  TextureFormat fboFormat;
  Surface *dst_local;
  FboColorClearCase *this_local;
  
  register0x00000000 = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  fmtInfo.lookupBias.m_data[2] = (float)tcu::getTextureChannelClass(fmtClass);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&rnd.m_rnd.z,(TextureFormat *)(fmtInfo.lookupBias.m_data + 3));
  de::Random::Random((Random *)&fbo,0x11);
  rbo = 0x10;
  local_7c = 0;
  local_80 = 0;
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,&local_7c);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,&local_80);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d41,
             local_80);
  sglr::ContextWrapper::glRenderbufferStorage
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d41,
             (this->super_FboColorbufferCase).m_format,
             *(int *)&(this->super_FboColorbufferCase).field_0x8c,this->m_height);
  FboTestCase::checkError((FboTestCase *)this);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
             local_7c);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,0x8ce0,
             0x8d41,local_80);
  FboTestCase::checkError((FboTestCase *)this);
  FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0,0,
             *(int *)&(this->super_FboColorbufferCase).field_0x8c,this->m_height);
  switch(fmtInfo.lookupBias.m_data[2]) {
  case 0.0:
  case 1.4013e-45:
  case 5.60519e-45:
    tcu::Vector<float,_4>::Vector(&local_9c,0.0);
    pfVar1 = tcu::Vector<float,_4>::getPtr(&local_9c);
    sglr::ContextWrapper::glClearBufferfv
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x1800,0,
               pfVar1);
    break;
  case 2.8026e-45:
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&x,0);
    piVar3 = tcu::Vector<int,_4>::getPtr((Vector<int,_4> *)&x);
    sglr::ContextWrapper::glClearBufferiv
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x1800,0,
               piVar3);
    break;
  case 4.2039e-45:
    tcu::Vector<unsigned_int,_4>::Vector(&local_ac,0);
    puVar2 = tcu::Vector<unsigned_int,_4>::getPtr(&local_ac);
    sglr::ContextWrapper::glClearBufferuiv
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x1800,0,
               puVar2);
  }
  sglr::ContextWrapper::glEnable
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xc11);
  for (y = 0; y < 0x10; y = y + 1) {
    x_00 = de::Random::getInt((Random *)&fbo,0,
                              *(int *)&(this->super_FboColorbufferCase).field_0x8c + -1);
    y_00 = de::Random::getInt((Random *)&fbo,0,this->m_height + -1);
    color.m_data[3] =
         (float)de::Random::getInt((Random *)&fbo,1,
                                   *(int *)&(this->super_FboColorbufferCase).field_0x8c - x_00);
    color.m_data[2] = (float)de::Random::getInt((Random *)&fbo,1,this->m_height - y_00);
    randomVector<4>((Functional *)local_e0,(Random *)&fbo,(Vector<float,_4> *)&rnd.m_rnd.z,
                    (Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2));
    sglr::ContextWrapper::glScissor
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,x_00,y_00,
               (int)color.m_data[3],(int)color.m_data[2]);
    switch(fmtInfo.lookupBias.m_data[2]) {
    case 0.0:
    case 1.4013e-45:
    case 5.60519e-45:
      pfVar1 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_e0);
      sglr::ContextWrapper::glClearBufferfv
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x1800,0,
                 pfVar1);
      break;
    case 2.8026e-45:
      tcu::Vector<float,_4>::cast<int>(&local_100);
      piVar3 = tcu::Vector<int,_4>::getPtr((Vector<int,_4> *)&local_100);
      sglr::ContextWrapper::glClearBufferiv
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x1800,0,
                 piVar3);
      break;
    case 4.2039e-45:
      tcu::Vector<float,_4>::cast<unsigned_int>(&local_f0);
      puVar2 = tcu::Vector<unsigned_int,_4>::getPtr((Vector<unsigned_int,_4> *)&local_f0);
      sglr::ContextWrapper::glClearBufferuiv
                (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x1800,0,
                 puVar2);
    }
  }
  FboTestCase::readPixels
            ((FboTestCase *)this,dst,0,0,*(int *)&(this->super_FboColorbufferCase).field_0x8c,
             this->m_height,(TextureFormat *)(fmtInfo.lookupBias.m_data + 3),
             (Vec4 *)(fmtInfo.valueMax.m_data + 2),(Vec4 *)(fmtInfo.lookupScale.m_data + 2));
  FboTestCase::checkError((FboTestCase *)this);
  de::Random::~Random((Random *)&fbo);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat			fboFormat	= glu::mapGLInternalFormat(m_format);
		tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(fboFormat.type);
		tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(fboFormat);
		de::Random					rnd			(17);
		const int					numClears	= 16;
		deUint32					fbo			= 0;
		deUint32					rbo			= 0;

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);

		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, m_format, m_width, m_height);
		checkError();

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_width, m_height);

		// Initialize to transparent black.
		switch (fmtClass)
		{
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				glClearBufferfv(GL_COLOR, 0, Vec4(0.0f).getPtr());
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				glClearBufferuiv(GL_COLOR, 0, UVec4(0).getPtr());
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				glClearBufferiv(GL_COLOR, 0, IVec4(0).getPtr());
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		// Do random scissored clears.
		glEnable(GL_SCISSOR_TEST);
		for (int ndx = 0; ndx < numClears; ndx++)
		{
			int		x		= rnd.getInt(0, m_width		- 1);
			int		y		= rnd.getInt(0, m_height	- 1);
			int		w		= rnd.getInt(1, m_width		- x);
			int		h		= rnd.getInt(1, m_height	- y);
			Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glScissor(x, y, w, h);

			switch (fmtClass)
			{
				case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
				case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
					glClearBufferfv(GL_COLOR, 0, color.getPtr());
					break;

				case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
					glClearBufferuiv(GL_COLOR, 0, color.cast<deUint32>().getPtr());
					break;

				case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
					glClearBufferiv(GL_COLOR, 0, color.cast<int>().getPtr());
					break;

				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		// Read results from renderbuffer.
		readPixels(dst, 0, 0, m_width, m_height, fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}